

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer2.c
# Opt level: O3

ktx_error_code_e ktxTexture2_DeflateZLIB(ktxTexture2 *This,ktx_uint32_t compressionLevel)

{
  ktx_uint32_t kVar1;
  ktxTexture2_private *pkVar2;
  uint uVar3;
  ktx_error_code_e kVar4;
  ktx_size_t kVar5;
  void *__ptr;
  ktx_uint8_t *__dest;
  ulong uVar6;
  size_t __size;
  ktx_size_t kVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  size_t levelByteLengthCmp;
  ktx_size_t local_50;
  ulong local_48;
  ktxTexture2 *local_40;
  long local_38;
  
  kVar4 = KTX_INVALID_OPERATION;
  if (This->supercompressionScheme == KTX_SS_BEGIN_RANGE) {
    kVar1 = This->numLevels;
    pkVar2 = This->_private;
    uVar3 = kVar1 - 1;
    if ((int)uVar3 < 0) {
      kVar7 = 0;
    }
    else {
      lVar8 = (ulong)uVar3 * 0x18;
      kVar7 = 0;
      do {
        kVar5 = ktxCompressZLIBBounds
                          (*(ktx_size_t *)((long)&pkVar2->_levelIndex[0].byteLength + lVar8));
        kVar7 = kVar7 + kVar5;
        lVar8 = lVar8 + -0x18;
      } while (lVar8 != -0x18);
    }
    uVar6 = (ulong)(kVar1 * 0x18);
    __ptr = malloc(uVar6 + kVar7);
    kVar4 = KTX_OUT_OF_MEMORY;
    if (__ptr != (void *)0x0) {
      uVar3 = This->numLevels - 1;
      local_48 = uVar6;
      if ((int)uVar3 < 0) {
        __size = 0;
      }
      else {
        lVar8 = (ulong)uVar3 + 1;
        lVar10 = (ulong)uVar3 * 0x18;
        __size = 0;
        lVar9 = 0;
        local_40 = This;
        do {
          local_50 = kVar7;
          local_38 = lVar8;
          kVar4 = ktxCompressZLIBInt((uchar *)((long)((long)__ptr + uVar6) + lVar9),&local_50,
                                     local_40->pData +
                                     *(long *)((long)&pkVar2->_levelIndex[0].byteOffset + lVar10),
                                     *(ktx_size_t *)
                                      ((long)&pkVar2->_levelIndex[0].byteLength + lVar10),
                                     compressionLevel);
          if (kVar4 != KTX_SUCCESS) {
            free(__ptr);
            return kVar4;
          }
          *(long *)((long)__ptr + lVar10) = lVar9;
          *(undefined8 *)((long)__ptr + lVar10 + 0x10) =
               *(undefined8 *)((long)&pkVar2->_levelIndex[0].byteLength + lVar10);
          *(ktx_size_t *)((long)__ptr + lVar10 + 8) = local_50;
          __size = __size + local_50;
          lVar9 = lVar9 + local_50;
          kVar7 = kVar7 - local_50;
          lVar10 = lVar10 + -0x18;
          lVar8 = local_38 + -1;
          This = local_40;
        } while (lVar8 != 0 && 0 < local_38);
      }
      __dest = (ktx_uint8_t *)malloc(__size);
      if (__dest == (ktx_uint8_t *)0x0) {
        free(__ptr);
        kVar4 = KTX_OUT_OF_MEMORY;
      }
      else {
        memcpy(__dest,(void *)((long)__ptr + uVar6),__size);
        memcpy(pkVar2->_levelIndex,__ptr,local_48);
        free(__ptr);
        free(This->pData);
        This->pData = __dest;
        This->dataSize = __size;
        This->supercompressionScheme = KTX_SS_END_RANGE;
        This->_private->_requiredLevelAlignment = 1;
        kVar4 = KTX_SUCCESS;
      }
    }
  }
  return kVar4;
}

Assistant:

KTX_error_code
ktxTexture2_DeflateZLIB(ktxTexture2* This, ktx_uint32_t compressionLevel)
{
    ktx_uint32_t levelIndexByteLength =
                            This->numLevels * sizeof(ktxLevelIndexEntry);
    ktx_uint8_t* workBuf;
    ktx_uint8_t* cmpData;
    ktx_size_t dstRemainingByteLength = 0;
    ktx_size_t byteLengthCmp = 0;
    ktx_size_t levelOffset = 0;
    ktxLevelIndexEntry* cindex = This->_private->_levelIndex;
    ktxLevelIndexEntry* nindex;
    ktx_uint8_t* pCmpDst;

    if (This->supercompressionScheme != KTX_SS_NONE)
        return KTX_INVALID_OPERATION;

    // On rare occasions the deflated data can be a few bytes larger than
    // the source data. Calculating the dst buffer size using
    // mz_deflateBound provides a conservative size to account for that.
    for (int32_t level = This->numLevels - 1; level >= 0; level--) {
        dstRemainingByteLength += ktxCompressZLIBBounds(cindex[level].byteLength);
    }

    workBuf = malloc(dstRemainingByteLength + levelIndexByteLength);
    if (workBuf == NULL)
        return KTX_OUT_OF_MEMORY;
    nindex = (ktxLevelIndexEntry*)workBuf;
    pCmpDst = &workBuf[levelIndexByteLength];

    for (int32_t level = This->numLevels - 1; level >= 0; level--) {
        size_t levelByteLengthCmp = dstRemainingByteLength;
        KTX_error_code result = ktxCompressZLIBInt(pCmpDst + levelOffset,
                                                    &levelByteLengthCmp,
                                                    &This->pData[cindex[level].byteOffset],
                                                    cindex[level].byteLength,
                                                    compressionLevel);
        if (result != KTX_SUCCESS) {
            free(workBuf);
            return result;
        }

        nindex[level].byteOffset = levelOffset;
        nindex[level].uncompressedByteLength = cindex[level].byteLength;
        nindex[level].byteLength = levelByteLengthCmp;
        byteLengthCmp += levelByteLengthCmp;
        levelOffset += levelByteLengthCmp;
        dstRemainingByteLength -= levelByteLengthCmp;
    }

    // Move the compressed data into a correctly sized buffer.
    cmpData = malloc(byteLengthCmp);
    if (cmpData == NULL) {
        free(workBuf);
        return KTX_OUT_OF_MEMORY;
    }
    // Now modify the texture.
    memcpy(cmpData, pCmpDst, byteLengthCmp); // Copy data to sized buffer.
    memcpy(cindex, nindex, levelIndexByteLength); // Update level index
    free(workBuf);
    free(This->pData);
    This->pData = cmpData;
    This->dataSize = byteLengthCmp;
    This->supercompressionScheme = KTX_SS_ZLIB;
    This->_private->_requiredLevelAlignment = 1;

    return KTX_SUCCESS;
}